

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Table * sqlite3LocateTableItem(Parse *pParse,u32 flags,SrcItem *p)

{
  Db *pDVar1;
  Schema *pSVar2;
  char **ppcVar3;
  Table *pTVar4;
  long lVar5;
  Schema **ppSVar6;
  
  if (p->pSchema == (Schema *)0x0) {
    ppcVar3 = &p->zDatabase;
  }
  else {
    pDVar1 = pParse->db->aDb;
    lVar5 = -0x100000000;
    ppSVar6 = &pDVar1->pSchema;
    do {
      lVar5 = lVar5 + 0x100000000;
      pSVar2 = *ppSVar6;
      ppSVar6 = ppSVar6 + 4;
    } while (pSVar2 != p->pSchema);
    ppcVar3 = (char **)((long)&pDVar1->zDbSName + (lVar5 >> 0x1b));
  }
  pTVar4 = sqlite3LocateTable(pParse,flags,p->zName,*ppcVar3);
  return pTVar4;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3LocateTableItem(
  Parse *pParse,
  u32 flags,
  SrcItem *p
){
  const char *zDb;
  assert( p->pSchema==0 || p->zDatabase==0 );
  if( p->pSchema ){
    int iDb = sqlite3SchemaToIndex(pParse->db, p->pSchema);
    zDb = pParse->db->aDb[iDb].zDbSName;
  }else{
    zDb = p->zDatabase;
  }
  return sqlite3LocateTable(pParse, flags, p->zName, zDb);
}